

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int rn3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  long lVar1;
  bool bVar2;
  type_conflict5 tVar3;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  long in_R8;
  int *in_R9;
  int in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000018;
  long in_stack_00000020;
  cpp_dec_float<50U,_int,_void> *in_stack_00000028;
  uint in_stack_00000030;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000040;
  long in_stack_00000048;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000050;
  int in_stack_00000058;
  long in_stack_00000060;
  int *in_stack_00000068;
  int *in_stack_00000070;
  int *rperm_3;
  int k_3;
  int j_3;
  int i_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_3;
  int *rperm_2;
  int k_2;
  int j_2;
  int i_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_2;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  int *in_stack_00000890;
  int *in_stack_00000898;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000008a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000008a8;
  int *in_stack_000008b0;
  int *in_stack_000008b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000008c0;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff808;
  cpp_dec_float<50U,_int,_void> *pcVar4;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff810;
  cpp_dec_float<50U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff878;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff8d0;
  int iVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9fc;
  int *in_stack_fffffffffffffa00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa08;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa10;
  cpp_dec_float<50U,_int,_void> local_5cc;
  undefined4 local_594;
  undefined1 local_590 [56];
  long local_558;
  uint local_550;
  int local_54c;
  int local_548;
  undefined1 local_544 [56];
  undefined4 local_50c;
  undefined1 local_508 [56];
  long local_4d0;
  uint local_4c8;
  uint local_4c4;
  int local_4c0;
  undefined1 local_4bc [56];
  undefined4 local_484 [12];
  int in_stack_fffffffffffffbac;
  int *in_stack_fffffffffffffbb0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbc8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbd0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbd8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbe0;
  int local_404;
  int local_400;
  undefined1 local_3fc [56];
  undefined4 local_3c4 [29];
  int *local_350;
  long local_348;
  int local_33c;
  int local_338;
  int local_334;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  undefined1 local_2f8 [56];
  undefined1 local_2c0 [56];
  undefined1 local_288 [56];
  int *local_250;
  long local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined4 *local_200;
  long local_1f8;
  undefined4 *local_1f0;
  long local_1e8;
  undefined4 *local_1e0;
  long local_1d8;
  undefined4 *local_1d0;
  long local_1c8;
  undefined1 *local_1b8;
  undefined1 *local_1a8;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe70;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_49;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  
  local_1b8 = local_288;
  local_250 = in_R9;
  local_248 = in_R8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  local_1a8 = local_2c0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  local_198 = local_2f8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  this_00 = (cpp_dec_float<50U,_int,_void> *)&stack0x00000030;
  pcVar4 = in_stack_00000028;
  vSolveLright3((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)x_3.m_backend._36_8_,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)x_3.m_backend.data._M_elems._28_8_,(int *)x_3.m_backend.data._M_elems._20_8_,
                (int *)x_3.m_backend.data._M_elems._12_8_,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)x_3.m_backend.data._M_elems._4_8_,_i_3,in_stack_00000890,in_stack_00000898,
                in_stack_000008a0,in_stack_000008a8,in_stack_000008b0,in_stack_000008b8,
                in_stack_000008c0);
  if (in_stack_00000060 == 0) {
    local_218 = local_3fc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
    lVar1 = *(long *)(in_RDI + 0x130);
    local_404 = 0;
    for (local_400 = 0; local_400 < in_stack_00000008; local_400 = local_400 + 1) {
      iVar5 = local_250[local_400];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      if (bVar2) {
        enQueueMax(local_250,&local_404,*(int *)(lVar1 + (long)iVar5 * 4));
      }
      else {
        local_484[0] = 0;
        local_1d8 = local_248 + (long)iVar5 * 0x38;
        local_1e0 = local_484;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar4);
      }
    }
  }
  else {
    local_220 = &local_330;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
    local_350 = in_stack_00000070;
    local_348 = *(long *)(in_RDI + 0x130);
    local_338 = 0;
    for (local_334 = 0; local_334 < in_stack_00000008; local_334 = local_334 + 1) {
      local_33c = local_250[local_334];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      in_stack_fffffffffffffe70 = &local_330;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      if (bVar2) {
        *local_350 = local_33c;
        local_350 = local_350 + 1;
        enQueueMax(local_250,&local_338,*(int *)(local_348 + (long)local_33c * 4));
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      }
      else {
        local_3c4[0] = 0;
        local_1c8 = local_248 + (long)local_33c * 0x38;
        local_1d0 = local_3c4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar4);
      }
    }
    *in_stack_00000068 = local_338;
  }
  if ((double)(int)in_stack_00000030 <= (double)*(int *)(in_RDI + 4) * 0.2) {
    local_210 = local_4bc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
    local_4d0 = *(long *)(in_RDI + 0x130);
    local_4c4 = 0;
    for (local_4c0 = 0; local_4c0 < (int)in_stack_00000030; local_4c0 = local_4c0 + 1) {
      local_4c8 = (in_stack_00000028->data)._M_elems[local_4c0];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      local_40 = local_508;
      local_48 = in_stack_00000018;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_49,in_stack_00000018);
      local_30 = local_508;
      local_38 = local_48;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      local_28 = local_508;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(this_00);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar4,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x364fac);
      if (tVar3) {
        enQueueMax((int *)in_stack_00000028,(int *)&local_4c4,
                   *(int *)(local_4d0 + (long)(int)local_4c8 * 4));
      }
      else {
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar4,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x364ff4);
        if (tVar3) {
          enQueueMax((int *)in_stack_00000028,(int *)&local_4c4,
                     *(int *)(local_4d0 + (long)(int)local_4c8 * 4));
        }
        else {
          local_50c = 0;
          local_1e8 = in_stack_00000020 + (long)(int)local_4c8 * 0x38;
          local_1f0 = &local_50c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (this_00,(long_long_type)pcVar4);
        }
      }
    }
    in_stack_00000030 = local_4c4;
  }
  else {
    (in_stack_00000028->data)._M_elems[0] = *(int *)(in_RDI + 4) - 1;
  }
  if ((double)in_stack_00000058 <= (double)*(int *)(in_RDI + 4) * 0.2) {
    local_208 = local_544;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
    local_558 = *(long *)(in_RDI + 0x130);
    local_54c = 0;
    for (local_548 = 0; local_548 < in_stack_00000058; local_548 = local_548 + 1) {
      local_550 = (in_stack_00000050->m_backend).data._M_elems[local_548];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar4);
      local_70 = local_590;
      local_78 = in_stack_00000040;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_79,in_stack_00000040);
      local_60 = local_590;
      local_68 = local_78;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
      local_58 = local_590;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(this_00);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar4,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x36524b);
      if (tVar3) {
        enQueueMax((int *)in_stack_00000050,&local_54c,
                   *(int *)(local_558 + (long)(int)local_550 * 4));
      }
      else {
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar4,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x365293);
        if (tVar3) {
          enQueueMax((int *)in_stack_00000050,&local_54c,
                     *(int *)(local_558 + (long)(int)local_550 * 4));
        }
        else {
          local_594 = 0;
          local_1f8 = in_stack_00000048 + (long)(int)local_550 * 0x38;
          local_200 = &local_594;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (this_00,(long_long_type)pcVar4);
        }
      }
    }
    in_stack_00000058 = local_54c;
  }
  else {
    (in_stack_00000050->m_backend).data._M_elems[0] = *(int *)(in_RDI + 4) - 1;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
  pcVar4 = &local_5cc;
  in_stack_00000008 =
       vSolveUright(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                    (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                    in_stack_fffffffffffffe70);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
  vSolveUrightNoNZ(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffffbd0,(int *)in_stack_fffffffffffffbc8,
                   in_stack_fffffffffffffbc4,in_stack_fffffffffffffbb8);
  iVar5 = in_stack_00000058;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
  vSolveUrightNoNZ(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffffbd0,(int *)in_stack_fffffffffffffbc8,
                   in_stack_fffffffffffffbc4,in_stack_fffffffffffffbb8);
  if (*(int *)(in_RDI + 400) == 0) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
    in_stack_00000008 =
         vSolveUpdateRight(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                           in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                           in_stack_fffffffffffff9f0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
    vSolveUpdateRightNoNZ
              (in_RSI,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT44(iVar5,in_stack_fffffffffffff8d0),in_stack_00000050);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar4);
    vSolveUpdateRightNoNZ
              (in_RSI,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT44(iVar5,in_stack_fffffffffffff8d0),in_stack_00000050);
  }
  return in_stack_00000008;
}

Assistant:

int CLUFactor<R>::vSolveRight4update3(R eps,
                                      R* vec, int* idx,                 /* result1 */
                                      R* rhs, int* ridx, int rn,        /* rhs1    */
                                      R* vec2, R eps2,               /* result2 */
                                      R* rhs2, int* ridx2, int rn2,     /* rhs2    */
                                      R* vec3, R eps3,               /* result3 */
                                      R* rhs3, int* ridx3, int rn3,     /* rhs3    */
                                      R* forest, int* forestNum, int* forestIdx)
{

   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;
   }

   if(rn3 > thedim * verySparseFactor4right)
   {
      ridx3[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn3; ++i)
      {
         k = ridx3[i];
         assert(k >= 0 && k < thedim);
         x = rhs3[k];

         if(x < -eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else if(x > eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else
            rhs3[k] = 0;
      }

      rn3 = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);
   vSolveUrightNoNZ(vec3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
      vSolveUpdateRightNoNZ(vec3, eps3);
   }

   return rn;
}